

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CategoricalMapping::MergeFrom
          (CategoricalMapping *this,CategoricalMapping *from)

{
  ulong uVar1;
  ulong uVar2;
  ValueOnUnknownUnion VVar3;
  LogMessage *other;
  Int64ToStringMap *this_00;
  StringToInt64Map *this_01;
  undefined8 *puVar4;
  undefined1 *puVar5;
  Arena *pAVar6;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/CategoricalMapping.pb.cc"
               ,399);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->_oneof_case_[0] != 1) {
    if (from->_oneof_case_[0] != 2) goto LAB_0031e2fa;
    if (this->_oneof_case_[0] == 2) {
      this_00 = (this->MappingType_).int64tostringmap_;
LAB_0031e29f:
      puVar5 = (undefined1 *)(from->MappingType_).int64tostringmap_;
    }
    else {
      clear_MappingType(this);
      this->_oneof_case_[0] = 2;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar6 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar6 = *(Arena **)pAVar6;
      }
      this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64ToStringMap>
                          (pAVar6);
      (this->MappingType_).int64tostringmap_ = this_00;
      if (from->_oneof_case_[0] == 2) goto LAB_0031e29f;
      puVar5 = _Int64ToStringMap_default_instance_;
    }
    Int64ToStringMap::MergeFrom(this_00,(Int64ToStringMap *)puVar5);
    goto LAB_0031e2fa;
  }
  if (this->_oneof_case_[0] == 1) {
    this_01 = (this->MappingType_).stringtoint64map_;
LAB_0031e2da:
    puVar5 = (undefined1 *)(from->MappingType_).stringtoint64map_;
  }
  else {
    clear_MappingType(this);
    this->_oneof_case_[0] = 1;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringToInt64Map>
                        (pAVar6);
    (this->MappingType_).stringtoint64map_ = this_01;
    if (from->_oneof_case_[0] == 1) goto LAB_0031e2da;
    puVar5 = _StringToInt64Map_default_instance_;
  }
  StringToInt64Map::MergeFrom(this_01,(StringToInt64Map *)puVar5);
LAB_0031e2fa:
  if (from->_oneof_case_[1] == 0x66) {
    VVar3 = from->ValueOnUnknown_;
    if (this->_oneof_case_[1] != 0x66) {
      clear_ValueOnUnknown(this);
      this->_oneof_case_[1] = 0x66;
    }
    this->ValueOnUnknown_ = VVar3;
  }
  else if (from->_oneof_case_[1] == 0x65) {
    uVar1 = (from->ValueOnUnknown_).int64value_;
    if (this->_oneof_case_[1] != 0x65) {
      clear_ValueOnUnknown(this);
      this->_oneof_case_[1] = 0x65;
      (this->ValueOnUnknown_).int64value_ =
           (int64_t)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&this->ValueOnUnknown_,uVar1 & 0xfffffffffffffffe,puVar4);
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void CategoricalMapping::MergeFrom(const CategoricalMapping& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CategoricalMapping)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.MappingType_case()) {
    case kStringToInt64Map: {
      _internal_mutable_stringtoint64map()->::CoreML::Specification::StringToInt64Map::MergeFrom(from._internal_stringtoint64map());
      break;
    }
    case kInt64ToStringMap: {
      _internal_mutable_int64tostringmap()->::CoreML::Specification::Int64ToStringMap::MergeFrom(from._internal_int64tostringmap());
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  switch (from.ValueOnUnknown_case()) {
    case kStrValue: {
      _internal_set_strvalue(from._internal_strvalue());
      break;
    }
    case kInt64Value: {
      _internal_set_int64value(from._internal_int64value());
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}